

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_function_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  JSValueUnion JVar2;
  int iVar3;
  JSRefCountHeader *p;
  char *str1;
  ulong uVar4;
  JSValue JVar5;
  JSValue JVar6;
  
  iVar3 = check_function(ctx,this_val);
  if (iVar3 != 0) {
    JVar5 = (JSValue)(ZEXT816(6) << 0x40);
    uVar4 = 0;
    goto LAB_001610c9;
  }
  uVar4 = (ulong)*(ushort *)((long)this_val.u.ptr + 6);
  str1 = "function ";
  if ((uVar4 < 0x32) && ((0x2200000012000U >> (uVar4 & 0x3f) & 1) != 0)) {
    lVar1 = *(long *)((long)this_val.u.ptr + 0x30);
    if (((*(ushort *)(lVar1 + 0x19) >> 10 & 1) == 0) || (*(char **)(lVar1 + 0x78) == (char *)0x0)) {
      str1 = &DAT_00179cbc + *(int *)(&DAT_00179cbc + (*(ushort *)(lVar1 + 0x19) >> 2 & 0xc));
      goto LAB_00161071;
    }
    JVar5 = JS_NewStringLen(ctx,*(char **)(lVar1 + 0x78),(long)*(int *)(lVar1 + 0x68));
  }
  else {
LAB_00161071:
    JVar5 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
    if ((int)JVar5.tag == 3) {
      JVar2 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
      JVar5.tag = -7;
      JVar5.u.ptr = JVar2.ptr;
    }
    JVar5 = JS_ConcatString3(ctx,str1,JVar5,"() {\n    [native code]\n}");
  }
  uVar4 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
LAB_001610c9:
  JVar6.tag = JVar5.tag;
  JVar6.u.ptr = (void *)(JVar5.u._0_4_ | uVar4);
  return JVar6;
}

Assistant:

static JSValue js_function_toString(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionKindEnum func_kind = JS_FUNC_NORMAL;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(this_val);
    if (js_class_has_bytecode(p->class_id)) {
        JSFunctionBytecode *b = p->u.func.function_bytecode;
        if (b->has_debug && b->debug.source) {
            return JS_NewStringLen(ctx, b->debug.source, b->debug.source_len);
        }
        func_kind = b->func_kind;
    }
    {
        JSValue name;
        const char *pref, *suff;

        switch(func_kind) {
        default:
        case JS_FUNC_NORMAL:
            pref = "function ";
            break;
        case JS_FUNC_GENERATOR:
            pref = "function *";
            break;
        case JS_FUNC_ASYNC:
            pref = "async function ";
            break;
        case JS_FUNC_ASYNC_GENERATOR:
            pref = "async function *";
            break;
        }
        suff = "() {\n    [native code]\n}";
        name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
        if (JS_IsUndefined(name))
            name = JS_AtomToString(ctx, JS_ATOM_empty_string);
        return JS_ConcatString3(ctx, pref, name, suff);
    }
}